

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

void change_var_names(MIR_context_t new_ctx,VARR_MIR_var_t *vars)

{
  MIR_var_t *pMVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  
  if (vars != (VARR_MIR_var_t *)0x0) {
    uVar4 = 0xffffffffffffffff;
    lVar3 = 8;
    do {
      uVar4 = uVar4 + 1;
      if (vars->els_num <= uVar4) {
        return;
      }
      pMVar1 = vars->varr;
      pcVar2 = get_ctx_str(new_ctx,*(char **)((long)&pMVar1->type + lVar3));
      *(char **)((long)&pMVar1->type + lVar3) = pcVar2;
      lVar3 = lVar3 + 0x18;
    } while (vars != (VARR_MIR_var_t *)0x0);
  }
  change_var_names_cold_1();
  return;
}

Assistant:

static void change_var_names (MIR_context_t new_ctx, VARR (MIR_var_t) * vars) {
  for (size_t i = 0; i < VARR_LENGTH (MIR_var_t, vars); i++) {
    MIR_var_t *var_ptr = &VARR_ADDR (MIR_var_t, vars)[i];
    var_ptr->name = get_ctx_str (new_ctx, var_ptr->name);
  }
}